

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int32_suite::fail_array16_int32_invalid_length(void)

{
  undefined4 local_4c;
  value local_48 [2];
  undefined1 local_40 [8];
  decoder decoder;
  value_type input [11];
  
  stack0xffffffffffffffed = 0x55443322110007bc;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[11]>
            ((decoder *)local_40,(uchar (*) [11])((long)&decoder.current.view._M_str + 5));
  local_48[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_40);
  local_4c = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::error_invalid_length",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x921,"void compact_int32_suite::fail_array16_int32_invalid_length()",local_48,
             &local_4c);
  return;
}

Assistant:

void fail_array16_int32_invalid_length()
{
    const value_type input[] = { token::code::array16_int32, 0x07, 0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_invalid_length);
}